

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

void __thiscall QWidgetTextControlPrivate::dragLeaveEvent(QWidgetTextControlPrivate *this)

{
  QObject *this_00;
  void *pvVar1;
  long in_FS_OFFSET;
  QRectF local_58;
  void *local_38;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QObject **)&this->field_0x8;
  local_58.w._0_4_ = 0xffffffff;
  local_58.w._4_4_ = 0xffffffff;
  local_58.h._0_4_ = 0xffffffff;
  local_58.h._4_4_ = 0xffffffff;
  local_58.xp._0_4_ = 0xffffffff;
  local_58.xp._4_4_ = 0xffffffff;
  local_58.yp._0_4_ = 0xffffffff;
  local_58.yp._4_4_ = 0xffffffff;
  QWidgetTextControl::cursorRect(&local_58,(QWidgetTextControl *)this_00,&this->dndFeedbackCursor);
  QTextCursor::QTextCursor((QTextCursor *)&local_38);
  pvVar1 = *(void **)&this->dndFeedbackCursor;
  *(void **)&this->dndFeedbackCursor = local_38;
  local_38 = pvVar1;
  QTextCursor::~QTextCursor((QTextCursor *)&local_38);
  if ((0.0 < (double)CONCAT44(local_58.w._4_4_,local_58.w._0_4_)) &&
     (0.0 < (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_))) {
    local_38 = (void *)0x0;
    local_30 = (undefined1 *)&local_58;
    QMetaObject::activate(this_00,&QWidgetTextControl::staticMetaObject,7,&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::dragLeaveEvent()
{
    Q_Q(QWidgetTextControl);

    const QRectF crect = q->cursorRect(dndFeedbackCursor);
    dndFeedbackCursor = QTextCursor();

    if (crect.isValid())
        emit q->updateRequest(crect);
}